

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirwrite.c
# Opt level: O2

int TIFFWriteDirectoryTagShortArray
              (TIFF *tif,uint32_t *ndir,TIFFDirEntry *dir,uint16_t tag,uint32_t count,
              uint16_t *value)

{
  int iVar1;
  
  if (dir != (TIFFDirEntry *)0x0) {
    iVar1 = TIFFWriteDirectoryTagCheckedShortArray(tif,ndir,dir,tag,count,value);
    return iVar1;
  }
  *ndir = *ndir + 1;
  return 1;
}

Assistant:

static int TIFFWriteDirectoryTagShortArray(TIFF *tif, uint32_t *ndir,
                                           TIFFDirEntry *dir, uint16_t tag,
                                           uint32_t count, uint16_t *value)
{
    if (dir == NULL)
    {
        (*ndir)++;
        return (1);
    }
    return (TIFFWriteDirectoryTagCheckedShortArray(tif, ndir, dir, tag, count,
                                                   value));
}